

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  *(undefined ***)&this->field_0xf0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcLShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__0078c288);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x78c1f8;
  *(undefined8 *)&this->field_0xf0 = 0x78c270;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x78c220
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x78c248;
  (this->Width).have = false;
  (this->FilletRadius).have = false;
  (this->EdgeRadius).have = false;
  (this->LegSlope).have = false;
  (this->CentreOfGravityInX).have = false;
  (this->CentreOfGravityInY).have = false;
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}